

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult ctr_el0_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  CPAccessResult CVar3;
  
  iVar1 = arm_current_el(env);
  CVar3 = CP_ACCESS_TRAP_EL2;
  if (iVar1 < 2) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if (iVar1 == 0) {
      if ((~uVar2 & 0x408000000) == 0) {
        if ((*(byte *)((long)&(env->cp15).field_2 + 0x11) & 0x80) == 0) {
          return CP_ACCESS_TRAP_EL2;
        }
        goto LAB_005a7e64;
      }
      if ((undefined1  [32])((undefined1  [32])(env->cp15).field_2 & (undefined1  [32])0x8000) ==
          (undefined1  [32])0x0) {
        return CP_ACCESS_TRAP;
      }
    }
    if (((uint)uVar2 >> 0x11 & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
LAB_005a7e64:
  iVar1 = arm_current_el(env);
  if ((1 < iVar1) || (uVar2 = arm_hcr_el2_eff_aarch64(env), ((uint)uVar2 >> 0x11 & 1) == 0)) {
    CVar3 = CP_ACCESS_OK;
  }
  return CVar3;
}

Assistant:

static CPAccessResult ctr_el0_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    int cur_el = arm_current_el(env);

    if (cur_el < 2) {
        uint64_t hcr = arm_hcr_el2_eff(env);

        if (cur_el == 0) {
            if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
                if (!(env->cp15.sctlr_el[2] & SCTLR_UCT)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                if (!(env->cp15.sctlr_el[1] & SCTLR_UCT)) {
                    return CP_ACCESS_TRAP;
                }
                if (hcr & HCR_TID2) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        } else if (hcr & HCR_TID2) {
            return CP_ACCESS_TRAP_EL2;
        }
    }

    if (arm_current_el(env) < 2 && arm_hcr_el2_eff(env) & HCR_TID2) {
        return CP_ACCESS_TRAP_EL2;
    }

    return CP_ACCESS_OK;
}